

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitFieldDeclaration(SyntaxDumper *this,FieldDeclarationSyntax *node)

{
  long lVar1;
  FieldDeclarationSyntax *pFVar2;
  SyntaxToken aSStack_58 [56];
  
  traverseDeclaration(this,(DeclarationSyntax *)node);
  pFVar2 = node + 0x28;
  while (lVar1 = *(long *)pFVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    pFVar2 = (FieldDeclarationSyntax *)(lVar1 + 0x10);
  }
  pFVar2 = node + 0x30;
  while (lVar1 = *(long *)pFVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,aSStack_58,node);
    psy::C::SyntaxToken::~SyntaxToken(aSStack_58);
    pFVar2 = (FieldDeclarationSyntax *)(lVar1 + 0x10);
  }
  FieldDeclarationSyntax::semicolonToken((FieldDeclarationSyntax *)aSStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aSStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken(aSStack_58);
  return Skip;
}

Assistant:

virtual Action visitFieldDeclaration(const FieldDeclarationSyntax* node) override
    {
        traverseDeclaration(node);
        for (auto iter = node->specifiers(); iter; iter = iter->next)
            nonterminal(iter->value);
        for (auto iter = node->declarators(); iter; iter = iter->next) {
            nonterminal(iter->value);
            terminal(iter->delimiterToken(), node);
        }
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }